

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlattribute.cpp
# Opt level: O3

string * __thiscall
libcellml::XmlAttribute::value_abi_cxx11_(string *__return_storage_ptr__,XmlAttribute *this)

{
  xmlAttrPtr pxVar1;
  char *__s;
  allocator<char> local_41;
  long *local_40 [2];
  long local_30 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pxVar1 = this->mPimpl->mXmlAttributePtr;
  __s = (char *)xmlGetProp(pxVar1->parent,pxVar1->name);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,__s,&local_41);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  (*_xmlFree)(__s);
  return __return_storage_ptr__;
}

Assistant:

std::string XmlAttribute::value() const
{
    std::string valueString;
    xmlChar *value = xmlGetProp(mPimpl->mXmlAttributePtr->parent, mPimpl->mXmlAttributePtr->name);
    valueString = std::string(reinterpret_cast<const char *>(value));
    xmlFree(value);
    return valueString;
}